

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall ChainstateManager::DetectSnapshotChainstate(ChainstateManager *this)

{
  uint256 base_blockhash_00;
  path chaindir;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  optional<uint256> base_blockhash;
  optional<fs::path> path;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  _List in_stack_ffffffffffffff38;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  path local_a8;
  _Storage<uint256,_true> local_80;
  char local_60;
  _Storage<fs::path,_false> local_58;
  char local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x1880,"bool ChainstateManager::DetectSnapshotChainstate()");
  }
  ::node::FindSnapshotChainstateDir
            ((optional<fs::path> *)&local_58._M_value,&(this->m_options).datadir);
  if (local_30 == '\x01') {
    std::filesystem::__cxx11::path::path(&local_a8,&local_58._M_value.super_path);
    chaindir.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff1c;
    chaindir.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffff18;
    chaindir.super_path._M_pathname._M_string_length = in_stack_ffffffffffffff20;
    chaindir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_ffffffffffffff28;
    chaindir.super_path._M_pathname.field_2._8_8_ = in_stack_ffffffffffffff30;
    chaindir.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         in_stack_ffffffffffffff38._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    ::node::ReadSnapshotBaseBlockhash((optional<uint256> *)&local_80._M_value,chaindir);
    std::filesystem::__cxx11::path::~path(&local_a8);
    if (local_60 != '\0') {
      _Var1._M_p = (pointer)&local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff38,
                 local_58._M_value.super_path._M_pathname._M_dataplus._M_p,
                 (pointer)(local_58._M_value.super_path._M_pathname._M_string_length +
                          (long)local_58._M_value.super_path._M_pathname._M_dataplus._M_p));
      logging_function._M_str = "DetectSnapshotChainstate";
      logging_function._M_len = 0x18;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x188a,ALL,Info,
                 "[snapshot] detected active snapshot chainstate (%s) - loading\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_b8) {
        operator_delete(_Var1._M_p,local_b8._M_allocated_capacity + 1);
      }
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[8] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[8];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[9] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[9];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[10] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[10];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0xb];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0xc];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0xd];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0xe];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0xf];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[1] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[1];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[2] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[2];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[3] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[3];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[4] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[4];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[5] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[5];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[6] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[6];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[7] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[7];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x10];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x11];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x12];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x13];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x14];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x15];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x16];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x17];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x18];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x19];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1a];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1b];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1c];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1d];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1e];
      base_blockhash_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_80._M_value.super_base_blob<256U>.m_data._M_elems[0x1f];
      ActivateExistingSnapshot(this,base_blockhash_00);
    }
  }
  else {
    local_60 = '\0';
  }
  if (local_30 == '\x01') {
    local_30 = '\0';
    std::filesystem::__cxx11::path::~path(&local_58._M_value.super_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)local_60;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::DetectSnapshotChainstate()
{
    assert(!m_snapshot_chainstate);
    std::optional<fs::path> path = node::FindSnapshotChainstateDir(m_options.datadir);
    if (!path) {
        return false;
    }
    std::optional<uint256> base_blockhash = node::ReadSnapshotBaseBlockhash(*path);
    if (!base_blockhash) {
        return false;
    }
    LogPrintf("[snapshot] detected active snapshot chainstate (%s) - loading\n",
        fs::PathToString(*path));

    this->ActivateExistingSnapshot(*base_blockhash);
    return true;
}